

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::reallocate(APInt *this,uint NewBitWidth)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint NewBitWidth_local;
  APInt *this_local;
  
  uVar2 = getNumWords(this);
  uVar3 = getNumWords(NewBitWidth);
  if (uVar2 == uVar3) {
    this->BitWidth = NewBitWidth;
  }
  else {
    bVar1 = isSingleWord(this);
    if ((!bVar1) && ((this->U).pVal != (uint64_t *)0x0)) {
      operator_delete__((this->U).pVal);
    }
    this->BitWidth = NewBitWidth;
    bVar1 = isSingleWord(this);
    if (!bVar1) {
      uVar2 = getNumWords(this);
      puVar4 = getMemory(uVar2);
      (this->U).pVal = puVar4;
    }
  }
  return;
}

Assistant:

void APInt::reallocate(unsigned NewBitWidth) {
  // If the number of words is the same we can just change the width and stop.
  if (getNumWords() == getNumWords(NewBitWidth)) {
    BitWidth = NewBitWidth;
    return;
  }

  // If we have an allocation, delete it.
  if (!isSingleWord())
    delete [] U.pVal;

  // Update BitWidth.
  BitWidth = NewBitWidth;

  // If we are supposed to have an allocation, create it.
  if (!isSingleWord())
    U.pVal = getMemory(getNumWords());
}